

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
boost::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                 dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  fmtflags __a;
  ctype *pcVar4;
  streamsize sVar5;
  size_type sVar6;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  ostream *in_RDI;
  bool rethrow;
  int_type ret;
  bitset_size_type i;
  fmtflags adjustfield;
  char fill_char;
  streamsize npad;
  bitset_size_type width;
  buffer_type *buf;
  char one;
  char zero;
  ctype<char> *fac;
  sentry cerberos;
  iostate err;
  iostate ok;
  undefined4 in_stack_fffffffffffffed8;
  _Ios_Iostate in_stack_fffffffffffffedc;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  long local_e0;
  ulong local_c8;
  int_type local_90;
  int_type local_8c;
  int_type local_88;
  int_type local_84;
  size_type local_80;
  int_type local_78;
  int_type local_74;
  _Ios_Fmtflags local_70;
  undefined1 local_69;
  long local_68;
  ulong local_60;
  undefined8 local_58;
  char_type local_4a;
  char_type local_49;
  locale local_48 [8];
  ctype *local_40;
  sentry local_28 [16];
  int local_18;
  undefined4 local_14;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  basic_ostream<char,_std::char_traits<char>_> *local_8;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
  std::ostream::sentry::sentry(local_28,in_RDI);
  bVar3 = std::ostream::sentry::operator_cast_to_bool(local_28);
  if (bVar3) {
    std::ios_base::getloc((ios_base *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
    ;
    pcVar4 = std::use_facet<std::ctype<char>>(local_48);
    std::locale::~locale(local_48);
    local_40 = pcVar4;
    local_49 = std::ctype<char>::widen
                         ((ctype<char> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
    local_4a = std::ctype<char>::widen
                         ((ctype<char> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
    local_58 = std::ios::rdbuf();
    sVar5 = std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
    if (sVar5 < 1) {
      local_c8 = 0;
    }
    else {
      local_c8 = std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
    }
    local_60 = local_c8;
    sVar6 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    uVar1 = local_60;
    if (sVar6 < local_c8) {
      sVar6 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
      local_e0 = uVar1 - sVar6;
    }
    else {
      local_e0 = 0;
    }
    local_68 = local_e0;
    local_69 = std::ios::fill();
    __a = std::ios_base::flags((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
    local_70 = std::operator&(__a,_S_adjustfield);
    if (local_70 != _S_left) {
      for (; 0 < local_68; local_68 = local_68 + -1) {
        local_74 = std::char_traits<char>::eof();
        local_78 = std::streambuf::sputc((char)local_58);
        bVar3 = std::char_traits<char>::eq_int_type(&local_74,&local_78);
        if (bVar3) {
          std::operator|=((_Ios_Iostate *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          break;
        }
      }
    }
    if (local_18 == 0) {
      for (local_80 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
          uVar2 = local_58, local_80 != 0; local_80 = local_80 - 1) {
        dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                  (in_stack_fffffffffffffee0,
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_84 = std::streambuf::sputc((char)uVar2);
        local_88 = std::char_traits<char>::eof();
        bVar3 = std::char_traits<char>::eq_int_type(&local_88,&local_84);
        if (bVar3) {
          std::operator|=((_Ios_Iostate *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          break;
        }
      }
    }
    if (local_18 == 0) {
      for (; 0 < local_68; local_68 = local_68 + -1) {
        local_8c = std::char_traits<char>::eof();
        local_90 = std::streambuf::sputc((char)local_58);
        bVar3 = std::char_traits<char>::eq_int_type(&local_8c,&local_90);
        if (bVar3) {
          std::operator|=((_Ios_Iostate *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          break;
        }
      }
    }
    std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),0);
  }
  if (local_18 != 0) {
    std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
  }
  std::ostream::sentry::~sentry(local_28);
  return local_8;
}

Assistant:

std::basic_ostream<Ch, Tr>&
operator<<(std::basic_ostream<Ch, Tr>& os,
           const dynamic_bitset<Block, Alloc>& b)
{

    using namespace std;

    const ios_base::iostate ok = ios_base::goodbit;
    ios_base::iostate err = ok;

    typename basic_ostream<Ch, Tr>::sentry cerberos(os);
    if (cerberos) {

        BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, os.getloc());
        const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
        const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        BOOST_TRY {

            typedef typename dynamic_bitset<Block, Alloc>::size_type bitset_size_type;
            typedef basic_streambuf<Ch, Tr> buffer_type;

            buffer_type * buf = os.rdbuf();
            // careful: os.width() is signed (and can be < 0)
            const bitset_size_type width = (os.width() <= 0) ? 0 : static_cast<bitset_size_type>(os.width());
            streamsize npad = (width <= b.size()) ? 0 : width - b.size();

            const Ch fill_char = os.fill();
            const ios_base::fmtflags adjustfield = os.flags() & ios_base::adjustfield;

            // if needed fill at left; pad is decreased along the way
            if (adjustfield != ios_base::left) {
                for (; 0 < npad; --npad)
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                          err |= ios_base::failbit;
                          break;
                    }
            }

            if (err == ok) {
                // output the bitset
                for (bitset_size_type i = b.size(); 0 < i; --i) {
                    typename buffer_type::int_type
                        ret = buf->sputc(b.test(i-1)? one : zero);
                    if (Tr::eq_int_type(Tr::eof(), ret)) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }

            if (err == ok) {
                // if needed fill at right
                for (; 0 < npad; --npad) {
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }


            os.width(0);

        } BOOST_CATCH (...) { // see std 27.6.1.1/4
            bool rethrow = false;
            BOOST_TRY { os.setstate(ios_base::failbit); } BOOST_CATCH (...) { rethrow = true; } BOOST_CATCH_END

            if (rethrow)
                BOOST_RETHROW;
        }